

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr_test.cc
# Opt level: O0

int main(void)

{
  int r;
  fdb_encryption_algorithm_t in_stack_00000214;
  
  system("rm -rf  filemgr_testfile");
  basic_test(in_stack_00000214);
  basic_test(in_stack_00000214);
  mt_init_test();
  return 0;
}

Assistant:

int main()
{
    int r = system(SHELL_DEL" filemgr_testfile");
    (void)r;

    basic_test(FDB_ENCRYPTION_NONE);
    basic_test(FDB_ENCRYPTION_BOGUS);
    mt_init_test();

    return 0;
}